

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_hook(lua_State *L,int event,int line,int ftransfer,int ntransfer)

{
  lua_Hook p_Var1;
  StkId pSVar2;
  CallInfo *pCVar3;
  long lVar4;
  StkId pSVar5;
  StkId pSVar6;
  ushort uVar7;
  lua_Debug ar;
  lua_Debug local_b8;
  
  p_Var1 = L->hook;
  if ((p_Var1 != (lua_Hook)0x0) && (L->allowhook != '\0')) {
    pSVar2 = (L->top).p;
    pCVar3 = L->ci;
    lVar4 = (L->stack).offset;
    pSVar5 = (pCVar3->top).p;
    if (ntransfer == 0) {
      uVar7 = 8;
      pSVar6 = pSVar2;
    }
    else {
      (pCVar3->u2).transferinfo.ftransfer = (unsigned_short)ftransfer;
      (pCVar3->u2).transferinfo.ntransfer = (unsigned_short)ntransfer;
      uVar7 = 0x108;
      pSVar6 = (L->top).p;
    }
    if (pSVar6 < pSVar5 && (pCVar3->callstatus & 2) == 0) {
      (L->top).p = pSVar5;
      pSVar6 = pSVar5;
    }
    local_b8.event = event;
    local_b8.currentline = line;
    local_b8.i_ci = pCVar3;
    if ((long)(L->stack_last).p - (long)pSVar6 < 0x150) {
      luaD_growstack(L,0x14,1);
      pSVar6 = (StkId)(L->top).offset;
    }
    if ((pCVar3->top).p < pSVar6 + 0x14) {
      (pCVar3->top).p = pSVar6 + 0x14;
    }
    L->allowhook = '\0';
    pCVar3->callstatus = pCVar3->callstatus | uVar7;
    (*p_Var1)(L,&local_b8);
    L->allowhook = '\x01';
    (pCVar3->top).p = (StkId)(((long)pSVar5 - lVar4) + (long)(L->stack).p);
    (L->top).p = (StkId)(((long)pSVar2 - lVar4) + (long)(L->stack).p);
    pCVar3->callstatus = pCVar3->callstatus & ~uVar7;
  }
  return;
}

Assistant:

void luaD_hook (lua_State *L, int event, int line,
                              int ftransfer, int ntransfer) {
  lua_Hook hook = L->hook;
  if (hook && L->allowhook) {  /* make sure there is a hook */
    int mask = CIST_HOOKED;
    CallInfo *ci = L->ci;
    ptrdiff_t top = savestack(L, L->top.p);  /* preserve original 'top' */
    ptrdiff_t ci_top = savestack(L, ci->top.p);  /* idem for 'ci->top' */
    lua_Debug ar;
    ar.event = event;
    ar.currentline = line;
    ar.i_ci = ci;
    if (ntransfer != 0) {
      mask |= CIST_TRAN;  /* 'ci' has transfer information */
      ci->u2.transferinfo.ftransfer = ftransfer;
      ci->u2.transferinfo.ntransfer = ntransfer;
    }
    if (isLua(ci) && L->top.p < ci->top.p)
      L->top.p = ci->top.p;  /* protect entire activation register */
    luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
    if (ci->top.p < L->top.p + LUA_MINSTACK)
      ci->top.p = L->top.p + LUA_MINSTACK;
    L->allowhook = 0;  /* cannot call hooks inside a hook */
    ci->callstatus |= mask;
    lua_unlock(L);
    (*hook)(L, &ar);
    lua_lock(L);
    lua_assert(!L->allowhook);
    L->allowhook = 1;
    ci->top.p = restorestack(L, ci_top);
    L->top.p = restorestack(L, top);
    ci->callstatus &= ~mask;
  }
}